

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

graph * __thiscall mpt::convertable::operator_cast_to_graph_(convertable *this)

{
  int iVar1;
  graph *local_28;
  graph *ptr;
  convertable *pcStack_18;
  int type;
  convertable *this_local;
  
  pcStack_18 = this;
  ptr._4_4_ = type_properties<mpt::layout::graph_*>::id(true);
  local_28 = (graph *)0x0;
  if ((0 < ptr._4_4_) &&
     (iVar1 = (**this->_vptr_convertable)(this,(long)ptr._4_4_,&local_28), -1 < iVar1)) {
    return local_28;
  }
  return (graph *)0x0;
}

Assistant:

mpt::convertable::operator T *()
{
	int type = mpt::type_properties<T *>::id(true);
	T *ptr = 0;
	if ((type <= 0) || (convert(type, &ptr) < 0)) {
		return 0;
	}
	return ptr;
}